

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tail.hpp
# Opt level: O1

array<int,_3UL>
njoy::ENDFtk::record::Tail::read<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *end)

{
  array<int,_3UL> aVar1;
  array<int,_3UL> result;
  _Type local_18;
  
  tools::disco::
  Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Integer<5u>>
  ::read<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int,int,int>
            (it,end,local_18,local_18 + 1,local_18 + 2);
  aVar1._M_elems[0] = local_18[0];
  aVar1._M_elems[1] = local_18[1];
  aVar1._M_elems[2] = local_18[2];
  return (array<int,_3UL>)aVar1._M_elems;
}

Assistant:

int material() const { return this->fields[0]; }